

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestNestedGroupExtensionInnerExtension::_InternalSerialize
          (TestNestedGroupExtensionInnerExtension *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32_t *puVar2;
  WireFormatLite *this_00;
  size_type sVar3;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  string_view _s;
  uint32_t cached_has_bits;
  TestNestedGroupExtensionInnerExtension *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestNestedGroupExtensionInnerExtension *this_local;
  
  _s._M_str._4_4_ = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._M_str._4_4_ = *puVar2;
  stream_local = (EpsCopyOutputStream *)target;
  if ((_s._M_str._4_4_ & 1) != 0) {
    _local_40 = _internal_inner_name(this);
    this_00 = (WireFormatLite *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"edition_unittest.TestNestedGroupExtensionInnerExtension.inner_name");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_50._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(sVar3 & 0xffffffff),1,(Operation)local_50._M_len,field_name);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,_local_40,target);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedGroupExtensionInnerExtension::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedGroupExtensionInnerExtension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedGroupExtensionInnerExtension)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string inner_name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_inner_name();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestNestedGroupExtensionInnerExtension.inner_name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedGroupExtensionInnerExtension)
  return target;
}